

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

bool __thiscall Polymer::CheckMaskCollisions(Polymer *this,Ptr *pol)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  runtime_error *this_00;
  long *plVar5;
  string err;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar3 = (this->mask_).super_MobileElement.start_;
  if (iVar3 <= this->stop_) {
    peVar1 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (iVar3 <= peVar1->stop_) {
      if (3 < peVar1->stop_ - iVar3) {
        std::operator+(&local_38,"Polymerase ",&peVar1->name_);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
        local_58 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_58 == plVar5) {
          local_48 = *plVar5;
          lStack_40 = plVar4[3];
          local_58 = &local_48;
        }
        else {
          local_48 = *plVar5;
        }
        local_50 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p);
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,(string *)&local_58);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = Mask::CheckInteraction(&this->mask_,&peVar1->name_);
      if (!bVar2) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)&((pol->
                                     super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr)->name_);
        if (iVar3 != 0) {
          return true;
        }
        if (this->attached_ != false) {
          return true;
        }
        if (this->degraded_elements_ != this->total_elements_) {
          return true;
        }
        if ((this->polymerases_).pol_count_ != 0) {
          return true;
        }
        this->degrade_ = true;
        return true;
      }
      (*this->_vptr_Polymer[2])(this);
    }
  }
  return false;
}

Assistant:

BindingSite::Ptr Polymer::FindBindingSite(MobileElement::Ptr pol,
                                          const std::string &promoter_name) {
  // Make a list of free promoters that pol can bind
  bool found = false;
  BindingSite::VecPtr promoter_choices;
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(start_, mask_.start(), results);
  for (auto &interval : results) {
    if (interval.value->name() == promoter_name &&
        !interval.value->IsCovered()) {
      promoter_choices.push_back(interval.value);
      found = true;
    }
  }
  // Error checking
  if (!found) {
    std::string err = "Polymerase " + pol->name() +
                      " could not find free promoter " + promoter_name +
                      " to bind in the polymer " + name_;
    throw std::runtime_error(err);
  }
  // Randomly select promoter.
  BindingSite::Ptr elem = Random::WeightedChoice(promoter_choices);
  // More error checking.
  if (!elem->CheckInteraction(pol->name())) {
    std::string err = "Polymerase " + pol->name() +
                      " does not interact with promoter " + promoter_name;
    throw std::runtime_error(err);
  }
  return elem;
}